

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

void kratos::topological_sort_helper
               (PackedStructGraph *g,PackedStructNode *node,
               unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
               *visited,queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                        *queue)

{
  iterator *piVar1;
  _Elt_pointer ppPVar2;
  set<kratos::PackedStructNode_*,_std::less<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
  *psVar3;
  __node_base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  PackedStructNode *local_38;
  PackedStructNode *node_local;
  
  local_38 = node;
  std::
  _Hashtable<kratos::PackedStructNode*,kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>,std::__detail::_Identity,std::equal_to<kratos::PackedStructNode*>,std::hash<kratos::PackedStructNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<kratos::PackedStructNode*&>
            ((_Hashtable<kratos::PackedStructNode*,kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>,std::__detail::_Identity,std::equal_to<kratos::PackedStructNode*>,std::hash<kratos::PackedStructNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&local_38);
  psVar3 = &local_38->children;
  for (p_Var5 = (local_38->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    p_Var4 = std::
             _Hashtable<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::PackedStructNode_*>,_std::hash<kratos::PackedStructNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::_M_find_before_node
                       (&visited->_M_h,*(ulong *)(p_Var5 + 1) % (visited->_M_h)._M_bucket_count,
                        (key_type *)(p_Var5 + 1),*(ulong *)(p_Var5 + 1));
    if ((p_Var4 == (__node_base_ptr)0x0) || (p_Var4->_M_nxt == (_Hash_node_base *)0x0)) {
      topological_sort_helper(g,*(PackedStructNode **)(p_Var5 + 1),visited,queue);
    }
  }
  ppPVar2 = (queue->c).
            super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppPVar2 ==
      (queue->c).
      super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>>::
    _M_push_back_aux<kratos::PackedStructNode*const&>
              ((deque<kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>> *)queue,
               &local_38);
  }
  else {
    *ppPVar2 = local_38;
    piVar1 = &(queue->c).
              super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void topological_sort_helper(PackedStructGraph *g, PackedStructNode *node,
                             std::unordered_set<PackedStructNode *> &visited,
                             std::queue<PackedStructNode *> &queue) {
    // mark it as visited
    visited.emplace(node);

    // visit all the child node
    for (auto const &child : node->children) {
        if (visited.find(child) == visited.end()) {
            // visit it
            topological_sort_helper(g, child, visited, queue);
        }
    }
    queue.push(node);
}